

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

int read_item(char **pp,char *end,string *buf,bool left)

{
  char cVar1;
  char *__first;
  int iVar2;
  char *local_48;
  char *p;
  char *value_end;
  char *value;
  int c;
  bool left_local;
  string *buf_local;
  char *end_local;
  char **pp_local;
  
  iVar2 = skip_blank(pp,end);
  if (iVar2 == 0x100) {
    std::__cxx11::string::clear();
    pp_local._4_4_ = 0x100;
  }
  else {
    __first = *pp;
    p = (char *)0x0;
    for (local_48 = __first; local_48 != end; local_48 = local_48 + 1) {
      cVar1 = *local_48;
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        if (p == (char *)0x0) {
          p = local_48;
        }
      }
      else {
        if ((((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == ';')) ||
           (((!left && (cVar1 == '#')) || ((left && (cVar1 == '=')))))) {
          if (p == (char *)0x0) {
            p = local_48;
          }
          *pp = local_48;
          goto LAB_001c4f86;
        }
        p = (char *)0x0;
      }
    }
    if (p == (char *)0x0) {
      p = end;
    }
    *pp = end;
LAB_001c4f86:
    if (p == (char *)0x0) {
      __assert_fail("value_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                    ,0x101,"int read_item(const char **, const char *, std::string &, bool)");
    }
    std::__cxx11::string::assign<char_const*,void>((string *)buf,__first,p);
    pp_local._4_4_ = skip_blank(pp,end);
  }
  return pp_local._4_4_;
}

Assistant:

static int read_item(const char** pp, const char* end, std::string& buf, bool left)
{
	int c = skip_blank(pp, end);
	if (c == IF_EOL) {
		buf.clear();
		return c;
	}
	const char* value = *pp;
	const char* value_end = 0;
	for (const char* p = value;; ++p) {
		if (p == end) {
			if (value_end == 0)
				value_end = end;
			*pp = end;
			break;
		}
		c = *p;
		if (c == ' ' || c =='\t') {
			if (value_end == 0)
				value_end = p;
		} else if (c == '\n' || c == '\r' || c == ';' || (!left && c == '#') || (left && c == '=')) {
			if (value_end == 0)
				value_end = p;
			*pp = p;
			break;
		} else {
			value_end = 0;
		}
	}
	xr_assert(value_end);
	buf.assign(value, value_end);
	return skip_blank(pp, end);
}